

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_error.cpp
# Opt level: O3

void throw_error(int err,char *action)

{
  size_t sVar1;
  ostream *poVar2;
  runtime_error *this;
  char *pcVar3;
  stringstream ss;
  char tmp [2048];
  string local_9d0 [32];
  stringstream local_9b0 [16];
  long local_9a0 [47];
  char local_828 [2056];
  
  std::__cxx11::stringstream::stringstream(local_9b0);
  if (action == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_9a0 + (int)*(undefined8 *)(local_9a0[0] + -0x18));
  }
  else {
    sVar1 = strlen(action);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_9a0,action,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_9a0," failed, error: ",0x10);
  if (err < 0x20) {
    if (err < 0xd) {
      if (err == 9) {
        pcVar3 = "EBADF";
        goto LAB_0010a81c;
      }
      if (err == 0xb) {
        pcVar3 = "EAGAIN";
        goto LAB_0010a81c;
      }
    }
    else {
      if (err == 0xd) {
        pcVar3 = "EACCES";
        goto LAB_0010a81c;
      }
      if (err == 0x16) {
        pcVar3 = "EINVAL";
        goto LAB_0010a81c;
      }
      if (err == 0x18) {
        pcVar3 = "EMFILE";
        goto LAB_0010a81c;
      }
    }
  }
  else if (err < 99) {
    if (err == 0x20) {
      pcVar3 = "EPIPE";
      goto LAB_0010a81c;
    }
    if (err == 0x62) {
      pcVar3 = "EADDRINUSE";
      goto LAB_0010a81c;
    }
  }
  else {
    if (err == 99) {
      pcVar3 = "EADDRNOTAVAIL";
      goto LAB_0010a81c;
    }
    if (err == 0x68) {
      pcVar3 = "ECONNRESET";
      goto LAB_0010a81c;
    }
    if (err == 0x6f) {
      pcVar3 = "ECONNREFUSED";
      goto LAB_0010a81c;
    }
  }
  pcVar3 = "<unknown error>";
LAB_0010a81c:
  sVar1 = strlen(pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_9a0,pcVar3,sVar1);
  pcVar3 = strerror_r(err,local_828,0x800);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_9a0," (",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_9a0,err);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_9d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throw_error [[noreturn]] (int err, char const* action)
{
    std::stringstream ss;
    ss << action << " failed, error: " << error_enum_name(err);
    char tmp[2048];
    char const* err_msg = strerror_r(err, tmp, sizeof tmp);
    ss << " (" << err << ", " << err_msg << ")";
    throw std::runtime_error(ss.str());
}